

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void benchmark_test(void)

{
  uint uVar1;
  allocator local_3e9;
  string local_3e8;
  rpc_server server;
  
  uVar1 = std::thread::hardware_concurrency();
  rest_rpc::rpc_service::rpc_server::rpc_server(&server,9000,(ulong)uVar1,0xf,10);
  std::__cxx11::string::string((string *)&local_3e8,"echo",&local_3e9);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,std::__cxx11::string(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&)>
            (&server,&local_3e8,echo);
  std::__cxx11::string::~string((string *)&local_3e8);
  rest_rpc::rpc_service::io_service_pool::run(&server.io_service_pool_);
  rest_rpc::rpc_service::rpc_server::~rpc_server(&server);
  return;
}

Assistant:

void benchmark_test() {
  rpc_server server(9000, std::thread::hardware_concurrency());
  server.register_handler("echo", echo);
  server.run();
}